

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_decompress4X1_usingDTable_internal_fast
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 HUF_DecompressFastLoopFn loopFn)

{
  BYTE *pBVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  BYTE *pBVar9;
  long lVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong *in_R10;
  ulong *puVar13;
  ulong in_R11;
  BYTE *pBVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  HUF_DecompressFastArgs args;
  HUF_DecompressFastArgs local_c8;
  
  puVar12 = (ulong *)DTable;
  sVar4 = HUF_DecompressFastArgs_init(&local_c8,dst,dstSize,cSrc,cSrcSize,DTable);
  if (sVar4 - 1 < 0xffffffffffffff88) {
    if (local_c8.ip[0] < local_c8.ilimit) {
      __assert_fail("args.ip[0] >= args.ilimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f5f,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    pBVar14 = (BYTE *)((long)cSrc + 6);
    HUF_decompress4X1_usingDTable_internal_fast_c_loop(&local_c8);
    if (local_c8.ip[0] < pBVar14) {
      __assert_fail("args.ip[0] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f65,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    if (local_c8.ip[1] < pBVar14) {
      __assert_fail("args.ip[1] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f66,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    if (local_c8.ip[2] < pBVar14) {
      __assert_fail("args.ip[2] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f67,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    if (local_c8.ip[3] < pBVar14) {
      __assert_fail("args.ip[3] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f68,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    pBVar1 = (BYTE *)((long)dst + dstSize);
    if (pBVar1 < local_c8.op[3]) {
      __assert_fail("args.op[3] <= oend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f69,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    uVar15 = dstSize + 3 >> 2;
    uVar11 = 0;
    bVar16 = false;
    do {
      uVar5 = (long)pBVar1 - (long)dst;
      dst = (BYTE *)((long)dst + uVar15);
      if (uVar5 < uVar15) {
        dst = pBVar1;
      }
      if ((dst < local_c8.op[uVar11]) ||
         (puVar13 = (ulong *)local_c8.ip[uVar11], puVar13 < local_c8.iend[uVar11] + -8)) {
        bVar17 = false;
        sVar6 = 0xffffffffffffffec;
        puVar13 = in_R10;
      }
      else {
        pBVar14 = (BYTE *)*puVar13;
        in_R11 = 0;
        for (uVar5 = local_c8.bits[uVar11]; (uVar5 & 1) == 0;
            uVar5 = uVar5 >> 1 | 0x8000000000000000) {
          in_R11 = in_R11 + 1;
        }
        cSrcSize = (long)local_c8.iend[0] + 8;
        bVar17 = true;
        sVar6 = 0;
        puVar12 = (ulong *)local_c8.iend[0];
      }
      if (bVar17) {
        pBVar9 = local_c8.op[uVar11];
        lVar10 = (long)dst - (long)pBVar9;
        if (3 < lVar10) {
          do {
            uVar2 = (uint)in_R11;
            if (uVar2 < 0x41) {
              if (puVar13 < cSrcSize) {
                if (puVar13 == puVar12) goto LAB_001c5750;
                uVar7 = in_R11 >> 3 & 0x1fffffff;
                bVar17 = puVar12 <= (ulong *)((long)puVar13 - uVar7);
                uVar5 = (ulong)(uint)((int)puVar13 - (int)puVar12);
                if (bVar17) {
                  uVar5 = uVar7;
                }
                uVar2 = uVar2 + (int)uVar5 * -8;
              }
              else {
                uVar5 = in_R11 >> 3 & 0x1fffffff;
                uVar2 = uVar2 & 7;
                bVar17 = true;
              }
              in_R11 = (ulong)uVar2;
              puVar13 = (ulong *)((long)puVar13 - uVar5);
              pBVar14 = (BYTE *)*puVar13;
            }
            else {
LAB_001c5750:
              bVar17 = false;
            }
            if (((BYTE *)((long)dst + -3) <= pBVar9) || (!bVar17)) goto LAB_001c586c;
            uVar5 = (ulong)((long)pBVar14 << (in_R11 & 0x3f)) >> 0x35;
            uVar2 = (uint)*(byte *)((long)DTable + uVar5 * 2 + 4) + (int)in_R11;
            *pBVar9 = *(BYTE *)((long)DTable + uVar5 * 2 + 5);
            uVar5 = (ulong)((long)pBVar14 << ((ulong)uVar2 & 0x3f)) >> 0x35;
            uVar2 = *(byte *)((long)DTable + uVar5 * 2 + 4) + uVar2;
            pBVar9[1] = *(BYTE *)((long)DTable + uVar5 * 2 + 5);
            uVar5 = (ulong)((long)pBVar14 << ((ulong)uVar2 & 0x3f)) >> 0x35;
            uVar2 = *(byte *)((long)DTable + uVar5 * 2 + 4) + uVar2;
            pBVar9[2] = *(BYTE *)((long)DTable + uVar5 * 2 + 5);
            uVar5 = (ulong)((long)pBVar14 << ((ulong)uVar2 & 0x3f)) >> 0x35;
            in_R11 = (ulong)(*(byte *)((long)DTable + uVar5 * 2 + 4) + uVar2);
            pBVar9[3] = *(BYTE *)((long)DTable + uVar5 * 2 + 5);
            pBVar9 = pBVar9 + 4;
          } while( true );
        }
        uVar2 = (uint)in_R11;
        if (uVar2 < 0x41) {
          if (puVar13 < cSrcSize) {
            if (puVar13 == puVar12) goto LAB_001c586c;
            uVar5 = in_R11 >> 3 & 0x1fffffff;
            uVar3 = (int)puVar13 - (int)puVar12;
            if (puVar12 <= (ulong *)((long)puVar13 - uVar5)) {
              uVar3 = (uint)uVar5;
            }
            uVar2 = uVar2 + uVar3 * -8;
          }
          else {
            uVar3 = (uint)(in_R11 >> 3) & 0x1fffffff;
            uVar2 = uVar2 & 7;
          }
          in_R11 = (ulong)uVar2;
          puVar13 = (ulong *)((long)puVar13 - (ulong)uVar3);
          pBVar14 = (BYTE *)*puVar13;
        }
LAB_001c586c:
        if (pBVar9 < dst) {
          lVar8 = 0;
          do {
            uVar5 = (ulong)((long)pBVar14 << (in_R11 & 0x3f)) >> 0x35;
            uVar2 = (uint)*(byte *)((long)DTable + uVar5 * 2 + 4) + (int)in_R11;
            pBVar9[lVar8] = *(BYTE *)((long)DTable + uVar5 * 2 + 5);
            lVar8 = lVar8 + 1;
            in_R11 = (ulong)uVar2;
          } while ((long)dst - (long)pBVar9 != lVar8);
        }
        else {
          uVar2 = (uint)in_R11;
        }
        pBVar9 = local_c8.op[uVar11];
        local_c8.op[uVar11] = pBVar9 + lVar10;
        bVar17 = pBVar9 + lVar10 == (BYTE *)dst;
        if (!bVar17) {
          sVar4 = 0xffffffffffffffec;
        }
        in_R11 = (ulong)uVar2;
        sVar6 = sVar4;
      }
      else {
        bVar17 = false;
      }
      sVar4 = sVar6;
      if (!bVar17) break;
      bVar16 = 2 < uVar11;
      uVar11 = uVar11 + 1;
      in_R10 = puVar13;
    } while (uVar11 != 4);
    if ((bVar16) && (sVar4 = dstSize, dstSize == 0)) {
      __assert_fail("dstSize != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f7e,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
  }
  return sVar4;
}

Assistant:

static HUF_FAST_BMI2_ATTRS
size_t
HUF_decompress4X1_usingDTable_internal_fast(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable,
    HUF_DecompressFastLoopFn loopFn)
{
    void const* dt = DTable + 1;
    const BYTE* const iend = (const BYTE*)cSrc + 6;
    BYTE* const oend = (BYTE*)dst + dstSize;
    HUF_DecompressFastArgs args;
    {   size_t const ret = HUF_DecompressFastArgs_init(&args, dst, dstSize, cSrc, cSrcSize, DTable);
        FORWARD_IF_ERROR(ret, "Failed to init fast loop args");
        if (ret == 0)
            return 0;
    }

    assert(args.ip[0] >= args.ilimit);
    loopFn(&args);

    /* Our loop guarantees that ip[] >= ilimit and that we haven't
    * overwritten any op[].
    */
    assert(args.ip[0] >= iend);
    assert(args.ip[1] >= iend);
    assert(args.ip[2] >= iend);
    assert(args.ip[3] >= iend);
    assert(args.op[3] <= oend);
    (void)iend;

    /* finish bit streams one by one. */
    {   size_t const segmentSize = (dstSize+3) / 4;
        BYTE* segmentEnd = (BYTE*)dst;
        int i;
        for (i = 0; i < 4; ++i) {
            BIT_DStream_t bit;
            if (segmentSize <= (size_t)(oend - segmentEnd))
                segmentEnd += segmentSize;
            else
                segmentEnd = oend;
            FORWARD_IF_ERROR(HUF_initRemainingDStream(&bit, &args, i, segmentEnd), "corruption");
            /* Decompress and validate that we've produced exactly the expected length. */
            args.op[i] += HUF_decodeStreamX1(args.op[i], &bit, segmentEnd, (HUF_DEltX1 const*)dt, HUF_DECODER_FAST_TABLELOG);
            if (args.op[i] != segmentEnd) return ERROR(corruption_detected);
        }
    }

    /* decoded size */
    assert(dstSize != 0);
    return dstSize;
}